

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalability_test.c
# Opt level: O0

int openclients(nng_socket *clients,int num)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_socket c;
  nng_duration t;
  int i;
  int num_local;
  nng_socket *clients_local;
  
  c.id = 0;
  while( true ) {
    if (num <= (int)c.id) {
      return 0;
    }
    result_ = 100;
    nVar1 = nng_req0_open((nng_socket *)&result__1);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                           ,0x32,"%s: expected success, got %s (%d)","nng_req0_open(&c)",pcVar3,
                           nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nVar1 = nng_socket_set_ms((nng_socket)result__1,"recv-timeout",result_);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                           ,0x33,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(c, NNG_OPT_RECVTIMEO, t)",pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    nVar1 = nng_socket_set_ms((nng_socket)result__1,"send-timeout",result_);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                           ,0x34,"%s: expected success, got %s (%d)",
                           "nng_socket_set_ms(c, NNG_OPT_SENDTIMEO, t)",pcVar3,nVar1);
    if (iVar2 == 0) break;
    nVar1 = nng_dial((nng_socket)result__1,addr,(nng_dialer *)0x0,0);
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/scalability_test.c"
                           ,0x35,"%s: expected success, got %s (%d)","nng_dial(c, addr, NULL, 0)",
                           pcVar3,nVar1);
    if (iVar2 == 0) {
      acutest_abort_();
    }
    clients[(int)c.id].id = result__1;
    c.id = c.id + 1;
  }
  acutest_abort_();
}

Assistant:

int
openclients(nng_socket *clients, int num)
{
	int          i;
	nng_duration t;
	for (i = 0; i < num; i++) {
		t = 100; // 100ms
		nng_socket c;
		NUTS_PASS(nng_req0_open(&c));
		NUTS_PASS(nng_socket_set_ms(c, NNG_OPT_RECVTIMEO, t));
		NUTS_PASS(nng_socket_set_ms(c, NNG_OPT_SENDTIMEO, t));
		NUTS_PASS(nng_dial(c, addr, NULL, 0));
		clients[i] = c;
	}
	return (0);
}